

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

void __thiscall
duckdb::Serializer::WriteValue<duckdb::ExportedTableInfo>
          (Serializer *this,vector<duckdb::ExportedTableInfo,_true> *vec)

{
  pointer pEVar1;
  ExportedTableInfo *item;
  pointer pEVar2;
  
  (*this->_vptr_Serializer[8])
            (this,((long)(vec->
                         super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                         ).
                         super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(vec->
                         super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                         ).
                         super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x3333333333333333);
  pEVar1 = (vec->super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
           ).
           super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar2 = (vec->
                super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>)
                .
                super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar2 != pEVar1; pEVar2 = pEVar2 + 1) {
    (*this->_vptr_Serializer[6])(this);
    WriteProperty<duckdb::ExportedTableData>(this,1,"table_data",&pEVar2->table_data);
    (*this->_vptr_Serializer[7])(this);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}